

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Value(RecyclableObjectDisplay *this,int radix)

{
  Type TVar1;
  Var pvVar2;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  code *pcVar3;
  double value;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  JavascriptNumberObject *this_01;
  JavascriptString *pJVar11;
  JavascriptString *pstRight;
  undefined4 extraout_var;
  char16 *pcVar12;
  
  bVar4 = TaggedInt::Is(this->instance);
  if (((!bVar4) && ((ulong)this->instance >> 0x32 == 0)) &&
     (bVar4 = VarIs<Js::JavascriptNumberObject>(this->instance), !bVar4)) {
    pvVar2 = this->instance;
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007eb48f;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar2);
    if (pvVar2 < (Var)0x4000000000000 && !bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_007eb48f;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Int64Number) goto LAB_007eadb0;
      }
      else {
        BVar5 = RecyclableObject::IsExternal(pRVar8);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_007eb48f;
          *puVar7 = 0;
        }
      }
    }
    pvVar2 = this->instance;
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007eb48f;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar2);
    if ((Var)0x3ffffffffffff < pvVar2 || bVar4) goto LAB_007eb420;
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007eb48f;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar5 = RecyclableObject::IsExternal(pRVar8);
      if (BVar5 != 0) {
LAB_007eb420:
        pRVar8 = VarTo<Js::RecyclableObject>(this->instance);
        this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
                  stringBuilder;
        this_00->length = 0;
        this_00->count = 0;
        this_00->lastChunk = (Data *)0x0;
        this_00->firstChunk = (Data *)0x0;
        this_00->secondChunk = (Data *)0x0;
        iVar6 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x50])(pRVar8,this_00,this->scriptContext);
        if (iVar6 == 0) {
          return L"undefined";
        }
        pcVar12 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
        return pcVar12;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (bVar4) {
        *puVar7 = 0;
        goto LAB_007eb420;
      }
      goto LAB_007eb48f;
    }
    if (TVar1 != TypeIds_LastNumberType) goto LAB_007eb420;
  }
LAB_007eadb0:
  bVar4 = TaggedInt::Is(this->instance);
  pvVar2 = this->instance;
  if (bVar4) {
    value = (double)(int)pvVar2;
  }
  else {
    if ((ulong)pvVar2 >> 0x32 != 0) {
      value = JavascriptNumber::GetValue(pvVar2);
      goto LAB_007eb18f;
    }
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007eb48f;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar2);
    if (!bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_007eb48f;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Int64Number) {
          pJVar9 = VarTo<Js::JavascriptTypedNumber<long>>(this->instance);
          value = (double)pJVar9->m_value;
          goto LAB_007eb18f;
        }
      }
      else {
        BVar5 = RecyclableObject::IsExternal(pRVar8);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_007eb48f;
          *puVar7 = 0;
        }
      }
    }
    pvVar2 = this->instance;
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007eb48f;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar2);
    if (pvVar2 < (Var)0x4000000000000 && !bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_007eb48f;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_LastNumberType) {
          pJVar10 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(this->instance);
          value = ((double)CONCAT44(0x43300000,(int)pJVar10->m_value) - 4503599627370496.0) +
                  ((double)CONCAT44(0x45300000,(int)(pJVar10->m_value >> 0x20)) -
                  1.9342813113834067e+25);
          goto LAB_007eb18f;
        }
      }
      else {
        BVar5 = RecyclableObject::IsExternal(pRVar8);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_007eb48f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
      }
    }
    this_01 = VarTo<Js::JavascriptNumberObject>(this->instance);
    value = JavascriptNumberObject::GetValue(this_01);
  }
LAB_007eb18f:
  if (((radix == 10) || (value != (double)(int)value)) || (NAN(value) || NAN((double)(int)value))) {
    BVar5 = JavascriptNumber::IsNegZero(value);
    if (BVar5 != 0) {
      return L"-0";
    }
    pJVar11 = JavascriptNumber::ToStringRadix10(value,this->scriptContext);
  }
  else {
    if (0x22 < radix - 2U) {
      return L"";
    }
    if (radix == 0x10) {
      pJVar11 = JavascriptLibrary::CreateStringFromCppLiteral<3ul>
                          ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,
                           (char16 (*) [3])L"0x");
      pstRight = JavascriptNumber::ToStringRadixHelper
                           ((double)(-(ulong)(value < 0.0) & (ulong)(double)(uint)(int)value |
                                    ~-(ulong)(value < 0.0) & (ulong)value),0x10,this->scriptContext)
      ;
      pJVar11 = JavascriptString::Concat(pJVar11,pstRight);
    }
    else {
      pJVar11 = JavascriptNumber::ToStringRadixHelper(value,radix,this->scriptContext);
    }
  }
  iVar6 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar11);
  return (LPCWSTR)CONCAT44(extraout_var,iVar6);
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Value(int radix)
    {
        LPCWSTR valueStr = _u("");

        if(Js::TaggedInt::Is(instance)
            || Js::JavascriptNumber::Is(instance)
            || Js::VarIs<Js::JavascriptNumberObject>(instance)
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
        {
            double value;
            if (Js::TaggedInt::Is(instance))
            {
                value = TaggedInt::ToDouble(instance);
            }
            else if (Js::JavascriptNumber::Is(instance))
            {
                value = Js::JavascriptNumber::GetValue(instance);
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number)
            {
                value = (double)VarTo<JavascriptInt64Number>(instance)->GetValue();
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
            {
                value = (double)VarTo<JavascriptUInt64Number>(instance)->GetValue();
            }
            else
            {
                Js::JavascriptNumberObject* numobj = Js::VarTo<Js::JavascriptNumberObject>(instance);
                value = numobj->GetValue();
            }

            // For fractional values, radix is ignored.
            int32 l = (int32)value;
            bool isZero = JavascriptNumber::IsZero(value - (double)l);

            if (radix == 10 || !isZero)
            {
                if (Js::JavascriptNumber::IsNegZero(value))
                {
                    // In debugger, we wanted to show negative zero explicitly
                    valueStr = _u("-0");
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadix10(value, scriptContext)->GetSz();
                }
            }
            else if (radix >= 2 && radix <= 36)
            {
                if (radix == 16)
                {
                    if (value < 0)
                    {
                        // On the tools side we show unsigned value.
                        uint32 ul = static_cast<uint32>(static_cast<int32>(value)); // ARM: casting negative value to uint32 gives 0
                        value = (double)ul;
                    }
                    valueStr = Js::JavascriptString::Concat(scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("0x")),
                                                            Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext))->GetSz();
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext)->GetSz();
                }
            }
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            if (obj->GetDiagValueString(builder, scriptContext))
            {
                valueStr = builder->Detach();
            }
            else
            {
                valueStr = _u("undefined");
            }
        }

        return valueStr;
    }